

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fail_function.hpp
# Opt level: O2

bool __thiscall
boost::spirit::qi::detail::
fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>
::operator()(fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>
             *this,plus<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_>_>
                   *component,unused_type *attr)

{
  bool bVar1;
  
  bVar1 = plus<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::push_back>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,3l>>>>
          ::
          parse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
                    ((plus<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::push_back>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,3l>>>>
                      *)component,
                     *(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       **)this,
                     *(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       **)(this + 8),*(unused_type **)(this + 0x10),*(unused_type **)(this + 0x18),
                     attr);
  return !bVar1;
}

Assistant:

bool operator()(Component const& component, Attribute& attr) const
        {
            // return true if the parser fails
            return !component.parse(first, last, context, skipper, attr);
        }